

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void tree_insert(Node *root,int x,int y,int p,int q)

{
  Node *pptVar1;
  bool bVar2;
  tNode *this;
  Node ptVar3;
  mapped_type *pmVar4;
  long lVar5;
  tNode *ptVar6;
  long lVar7;
  char target;
  Node next;
  string conv_array [12];
  char local_313;
  allocator local_312;
  allocator local_311;
  Node *local_310;
  tNode *local_308;
  long local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  this = (tNode *)operator_new(0x140);
  tNode::tNode(this);
  ptVar3 = *root;
  ptVar6 = this;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 1) {
      ptVar6->board[0][lVar7] = ptVar3->board[0][lVar7];
    }
    ptVar3 = (Node)(ptVar3->board + 1);
    ptVar6 = (tNode *)(ptVar6->board + 1);
  }
  lVar5 = (long)p;
  local_313 = this->board[lVar5][q];
  this->board[lVar5][q] = this->board[x][y];
  this->board[x][y] = ' ';
  local_310 = root;
  local_308 = this;
  bVar2 = is_repeat(&local_308);
  if (bVar2) {
    tNode::~tNode(this);
    operator_delete(this);
    return;
  }
  local_300 = lVar5;
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::operator=(&(this->materials)._M_t,&((*local_310)->materials)._M_t);
  if (local_313 != ' ') {
    pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&this->materials,&local_313);
    *pmVar4 = *pmVar4 + -1;
  }
  pptVar1 = local_310;
  std::__cxx11::string::_M_assign((string *)&this->w_king_pos);
  std::__cxx11::string::_M_assign((string *)&this->b_king_pos);
  this->cur_side = (bool)((*pptVar1)->cur_side ^ 1);
  std::__cxx11::string::string((string *)&local_1b8,"0",(allocator *)&local_1d8);
  std::__cxx11::string::string(local_198,"1",(allocator *)&local_1f8);
  std::__cxx11::string::string(local_178,"2",(allocator *)&local_218);
  std::__cxx11::string::string(local_158,"3",(allocator *)&local_238);
  std::__cxx11::string::string(local_138,"4",(allocator *)&local_258);
  std::__cxx11::string::string(local_118,"5",(allocator *)&local_278);
  std::__cxx11::string::string(local_f8,"6",(allocator *)&local_298);
  std::__cxx11::string::string(local_d8,"7",(allocator *)&local_2b8);
  std::__cxx11::string::string(local_b8,"8",(allocator *)&local_2d8);
  std::__cxx11::string::string(local_98,"9",(allocator *)&local_2f8);
  std::__cxx11::string::string(local_78,"10",&local_311);
  std::__cxx11::string::string(local_58,"11",&local_312);
  std::operator+(&local_2f8,"(",&local_1b8 + x);
  std::operator+(&local_2d8,&local_2f8,",");
  lVar5 = local_300;
  std::operator+(&local_2b8,&local_2d8,&local_1b8 + y);
  std::operator+(&local_298,&local_2b8,")");
  std::operator+(&local_278,&local_298,"->");
  std::operator+(&local_258,&local_278,"(");
  std::operator+(&local_238,&local_258,&local_1b8 + lVar5);
  std::operator+(&local_218,&local_238,",");
  std::operator+(&local_1f8,&local_218,&local_1b8 + q);
  std::operator+(&local_1d8,&local_1f8,")");
  std::__cxx11::string::operator=((string *)&this->mv,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::vector<tNode_*,_std::allocator<tNode_*>_>::push_back(&(*local_310)->next,&local_308);
  lVar5 = 0x160;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b8._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  return;
}

Assistant:

void tree_insert(Node& root, int x, int y, int p, int q){

    Node next = new tNode;

    // Copying the current board state to the new board state
    int a, b;
    for(a=0; a<12; a++){
        for(b=0; b<12; b++){
            next->board[a][b] = root->board[a][b];
        }
    }

    // Moving the piece from (x,y) to (p,q), replacing if needed
    char source = next->board[x][y];
    char target = next->board[p][q];
    next->board[p][q] = source;
    next->board[x][y] = ' ';

    // Checks if this board state has already been examined; skips it if it has been examined
    if(!is_repeat(next)){

        next->materials = root->materials;
        if(' ' != target)
            next->materials[target] -= 1;

        // Copying attributes from old node to new node
        next->w_king_pos = root->w_king_pos;
        next->b_king_pos = root->b_king_pos;
        next->cur_side = !(root->cur_side);

        string conv_array[12] = {"0", "1", "2", "3", "4", "5", "6", "7", "8", "9", "10", "11"};
        next->mv = "(" + conv_array[x] +  "," + conv_array[y] + ")" + "->" + "(" + conv_array[p] +  "," + conv_array[q] + ")";

        root->next.push_back(next);
    }
    else{
        delete next;
    }
}